

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointLight.cpp
# Opt level: O0

double __thiscall PointLight::shadow(PointLight *this,Scene *scene,Vector *p,Vector *l)

{
  double dVar1;
  Vector local_138;
  GeometricObject *local_120;
  GeometricObject *occlude;
  SurfaceData texture;
  Ray r;
  double attenuation;
  double dist;
  double t;
  Vector *local_30;
  Vector *l_local;
  Vector *p_local;
  Scene *scene_local;
  PointLight *this_local;
  
  local_30 = l;
  l_local = p;
  p_local = (Vector *)scene;
  scene_local = (Scene *)this;
  operator-((Vector *)&t,&this->loc,p);
  Vector::operator=(local_30,(Vector *)&t);
  attenuation = Vector::operator!(local_30);
  dVar1 = this->dist_scale / attenuation;
  r.dir.z = dVar1 * dVar1;
  Vector::operator/=(local_30,attenuation);
  Ray::Ray((Ray *)&texture.map_coord.z,l_local,local_30);
  Grayzer::SurfaceData::SurfaceData((SurfaceData *)&occlude);
  while( true ) {
    local_120 = (GeometricObject *)
                (**(code **)((long)p_local->x + 0x10))(p_local,&texture.map_coord.z,&dist);
    if (local_120 == (GeometricObject *)0x0 || attenuation <= dist) {
      return r.dir.z;
    }
    Ray::point(&local_138,(Ray *)&texture.map_coord.z,dist);
    Vector::operator=((Vector *)&texture.map_coord.z,&local_138);
    GeometricObject::find_texture(local_120,(Vector *)&texture.map_coord.z,(SurfaceData *)&occlude);
    if (texture.kr < threshold) break;
    r.dir.z = texture.kr * r.dir.z;
    if (r.dir.z < threshold) {
      return 0.0;
    }
    attenuation = attenuation - dist;
  }
  return 0.0;
}

Assistant:

double PointLight::shadow(Scene* scene, Vector&  p, Vector& l)
{
   l = loc - p;

   double t;
   double dist = !l;
   double attenuation = dist_scale  / dist;
   attenuation = attenuation *   attenuation;

   l /= dist;

   Ray   r(p,l);
   SurfaceData texture;
   GeometricObject *occlude;

   while ((occlude = scene->intersect(r,t)) != 0 && dist > t)
   {
      r.org = r.point(t);

      occlude->find_texture(r.org, texture);

      if (texture.kt < threshold) return 0; // объект непрозрачен
      if ((attenuation *= texture.kt) < threshold) return 0;
      dist -= t;
   }
   return attenuation;
}